

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void anon_unknown.dwarf_1dcce3b::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer pEVar1;
  int *piVar2;
  pointer pcVar3;
  cmSourceGroup *pcVar4;
  size_type sVar5;
  cmMakefile *this;
  size_type sVar6;
  _Base_ptr this_00;
  cmSourceFile *this_01;
  string *psVar7;
  cmSourceGroup *pcVar8;
  cmSourceGroup *pcVar9;
  pointer puVar10;
  cmSourceGroup *sg;
  _Base_ptr p_Var11;
  char cVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  string w;
  string e;
  string path;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_1b0;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  cmake *local_130;
  string local_128;
  TargetPropertyEntry local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  char local_e0;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_d8;
  cmFileSet *local_d0;
  undefined1 local_c8 [16];
  pointer local_b8;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  string *local_98;
  cmGeneratorExpressionDAGChecker *local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_78;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmFileSet::CompileDirectoryEntries(&local_60,fileSet);
  local_98 = config;
  local_90 = dagChecker;
  cmFileSet::EvaluateDirectoryEntries
            (&local_48,fileSet,&local_60,headTarget->LocalGenerator,config,headTarget,dagChecker);
  if (local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar12 = '\0';
  }
  else {
    do {
      puVar10 = local_60.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1;
      cVar12 = (((local_60.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
               HadContextSensitiveCondition;
      if ((bool)cVar12 != false) break;
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar10;
    } while (puVar10 !=
             local_60.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_130 = cmLocalGenerator::GetCMakeInstance(headTarget->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_78,fileSet);
  local_a0 = (_Base_ptr)
             local_78.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var11 = (_Base_ptr)
              local_78.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (_Base_ptr)entries;
    do {
      this_00 = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,&local_48);
      local_d8._M_t.
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           *(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
             *)p_Var11;
      *(__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        *)p_Var11 = (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
                     )0x0;
      local_108.LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00952960;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
      local_c8 = (undefined1  [16])0x0;
      local_b8 = (pointer)0x0;
      local_190._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              )0x0;
      local_e0 = cVar12;
      local_d0 = fileSet;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
      EvaluateTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_168,headTarget,local_98,&local_1b0,local_90,
                 &local_108);
      std::
      vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                ((vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                  *)this_00,(EvaluatedTargetPropertyEntry *)local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_150);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_168._17_7_,local_168[0x10])
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_168._17_7_,local_168[0x10]));
      }
      local_88 = p_Var11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                 local_1b0.field_2._M_local_buf[0]) + 1);
      }
      pEVar1 = (pointer)this_00->_M_parent;
      p_Var11 = (_Base_ptr)
                pEVar1[-1].Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_80 = (_Base_ptr)
                 pEVar1[-1].Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var11 != local_80) {
        do {
          this_01 = cmMakefile::GetOrCreateSource
                              (headTarget->Makefile,(string *)p_Var11,false,Ambiguous);
          if (((fileSet->Type)._M_string_length == 7) &&
             (piVar2 = (int *)(fileSet->Type)._M_dataplus._M_p,
             *(int *)((long)piVar2 + 3) == 0x53524544 && *piVar2 == 0x44414548)) {
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_168,"HEADER_FILE_ONLY","");
            cmSourceFile::SetProperty(this_01,(string *)local_168,"TRUE");
            if ((cmLinkImplItem *)local_168._0_8_ != (cmLinkImplItem *)(local_168 + 0x10)) {
              operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1
                             );
            }
          }
          local_168._0_8_ = local_168 + 0x10;
          local_168._8_8_ = (element_type *)0x0;
          local_168[0x10] = '\0';
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          local_1b0._M_string_length = 0;
          local_1b0.field_2._M_local_buf[0] = '\0';
          psVar7 = cmSourceFile::ResolveFullPath(this_01,(string *)local_168,&local_1b0);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          pcVar3 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar3,pcVar3 + psVar7->_M_string_length);
          if (local_1b0._M_string_length != 0) {
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_188);
            cmake::IssueMessage(local_130,AUTHOR_WARNING,&local_1b0,(cmListFileBacktrace *)local_188
                               );
            if ((cmMakefile *)local_188._8_8_ != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
            }
          }
          sVar6 = local_128._M_string_length;
          if (local_128._M_string_length == 0) {
            if ((element_type *)local_168._8_8_ != (element_type *)0x0) {
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_188);
              cmake::IssueMessage(local_130,FATAL_ERROR,(string *)local_168,
                                  (cmListFileBacktrace *)local_188);
              if ((cmMakefile *)local_188._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
              }
            }
          }
          else {
            pcVar4 = (headTarget->Makefile->SourceGroups).
                     super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pcVar9 = (headTarget->Makefile->SourceGroups).
                          super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                          super__Vector_impl_data._M_start; pcVar9 != pcVar4; pcVar9 = pcVar9 + 1) {
              pcVar8 = cmSourceGroup::MatchChildrenFiles(pcVar9,&local_128);
              if (pcVar8 != (cmSourceGroup *)0x0) goto LAB_004c1944;
            }
            piVar2 = (int *)(fileSet->Type)._M_dataplus._M_p;
            sVar5 = (fileSet->Type)._M_string_length;
            if (sVar5 == 0x17) {
              auVar13[0] = -((char)*piVar2 == 'C');
              auVar13[1] = -(*(char *)((long)piVar2 + 1) == 'X');
              auVar13[2] = -(*(char *)((long)piVar2 + 2) == 'X');
              auVar13[3] = -(*(char *)((long)piVar2 + 3) == '_');
              auVar13[4] = -((char)piVar2[1] == 'M');
              auVar13[5] = -(*(char *)((long)piVar2 + 5) == 'O');
              auVar13[6] = -(*(char *)((long)piVar2 + 6) == 'D');
              auVar13[7] = -(*(char *)((long)piVar2 + 7) == 'U');
              auVar13[8] = -((char)piVar2[2] == 'L');
              auVar13[9] = -(*(char *)((long)piVar2 + 9) == 'E');
              auVar13[10] = -(*(char *)((long)piVar2 + 10) == '_');
              auVar13[0xb] = -(*(char *)((long)piVar2 + 0xb) == 'H');
              auVar13[0xc] = -((char)piVar2[3] == 'E');
              auVar13[0xd] = -(*(char *)((long)piVar2 + 0xd) == 'A');
              auVar13[0xe] = -(*(char *)((long)piVar2 + 0xe) == 'D');
              auVar13[0xf] = -(*(char *)((long)piVar2 + 0xf) == 'E');
              auVar14[0] = -(*(char *)((long)piVar2 + 7) == 'U');
              auVar14[1] = -((char)piVar2[2] == 'L');
              auVar14[2] = -(*(char *)((long)piVar2 + 9) == 'E');
              auVar14[3] = -(*(char *)((long)piVar2 + 10) == '_');
              auVar14[4] = -(*(char *)((long)piVar2 + 0xb) == 'H');
              auVar14[5] = -((char)piVar2[3] == 'E');
              auVar14[6] = -(*(char *)((long)piVar2 + 0xd) == 'A');
              auVar14[7] = -(*(char *)((long)piVar2 + 0xe) == 'D');
              auVar14[8] = -(*(char *)((long)piVar2 + 0xf) == 'E');
              auVar14[9] = -((char)piVar2[4] == 'R');
              auVar14[10] = -(*(char *)((long)piVar2 + 0x11) == '_');
              auVar14[0xb] = -(*(char *)((long)piVar2 + 0x12) == 'U');
              auVar14[0xc] = -(*(char *)((long)piVar2 + 0x13) == 'N');
              auVar14[0xd] = -((char)piVar2[5] == 'I');
              auVar14[0xe] = -(*(char *)((long)piVar2 + 0x15) == 'T');
              auVar14[0xf] = -(*(char *)((long)piVar2 + 0x16) == 'S');
              auVar14 = auVar14 & auVar13;
              if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) goto LAB_004c18e4;
            }
            else if ((sVar5 == 7) &&
                    (*(int *)((long)piVar2 + 3) == 0x53524544 && *piVar2 == 0x44414548)) {
LAB_004c18e4:
              this = headTarget->Makefile;
              local_188._0_8_ = local_188 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"Header Files","")
              ;
              pcVar9 = cmMakefile::GetOrCreateSourceGroup(this,(string *)local_188);
              cmSourceGroup::AddGroupFile(pcVar9,&local_128);
              if ((cmTarget *)local_188._0_8_ != (cmTarget *)(local_188 + 0x10)) {
                operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
              }
            }
          }
LAB_004c1944:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                                     local_1b0.field_2._M_local_buf[0]) + 1);
          }
          if ((cmLinkImplItem *)local_168._0_8_ != (cmLinkImplItem *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,CONCAT71(local_168._17_7_,local_168[0x10]) + 1);
          }
          if (sVar6 == 0) {
            local_108._vptr_TargetPropertyEntry =
                 (_func_int **)&PTR__TargetPropertyEntryFileSet_00952960;
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr(&local_d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_f8);
            goto LAB_004c1a3b;
          }
          p_Var11 = p_Var11 + 1;
        } while (p_Var11 != local_80);
      }
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00952960;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr(&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      p_Var11 = (_Base_ptr)&local_88->_M_parent;
    } while (p_Var11 != local_a0);
  }
LAB_004c1a3b:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    for (auto const& file : entries.Entries.back().Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w,
                         headTarget->GetBacktrace());
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e,
                           headTarget->GetBacktrace());
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s ||
            fileSet->GetType() == "CXX_MODULE_HEADER_UNITS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}